

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

uint __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::find_index(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
             *this,cluster_id *k)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  node *pnVar4;
  cluster_id *in_RDI;
  int orig_index;
  node *pNode;
  int index;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  cluster_id *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (*(int *)&in_RDI[1].m_cells.m_p != 0) {
    uVar2 = hash_key((hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                      *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
    pnVar4 = get_node((hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                       *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (uint)((ulong)in_RDI >> 0x20));
    if ((pnVar4->super_value_type).field_0x1c != '\0') {
      bVar1 = equal_to<crnlib::qdxt1::cluster_id>::operator()
                        ((equal_to<crnlib::qdxt1::cluster_id> *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI,
                         (cluster_id *)0x184abb);
      uVar3 = uVar2;
      while( true ) {
        if (bVar1) {
          return uVar3;
        }
        if (uVar3 == 0) {
          uVar3 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
                  ::size((vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
                          *)in_RDI);
          uVar3 = uVar3 - 1;
          pnVar4 = get_node((hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                             *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                            (uint)((ulong)in_RDI >> 0x20));
        }
        else {
          uVar3 = uVar3 - 1;
          pnVar4 = pnVar4 + -1;
        }
        if ((uVar3 == uVar2) || ((pnVar4->super_value_type).field_0x1c == '\0')) break;
        bVar1 = equal_to<crnlib::qdxt1::cluster_id>::operator()
                          ((equal_to<crnlib::qdxt1::cluster_id> *)
                           CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_RDI,(cluster_id *)0x184b4a);
      }
    }
  }
  uVar2 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
          ::size((vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
                  *)in_RDI);
  return uVar2;
}

Assistant:

inline uint find_index(const Key& k) const {
    if (m_num_valid) {
      int index = hash_key(k);
      const node* pNode = &get_node(index);

      if (pNode->state) {
        if (m_equals(pNode->first, k))
          return index;

        const int orig_index = index;

        for (;;) {
          if (!index) {
            index = m_values.size() - 1;
            pNode = &get_node(index);
          } else {
            index--;
            pNode--;
          }

          if (index == orig_index)
            break;

          if (!pNode->state)
            break;

          if (m_equals(pNode->first, k))
            return index;
        }
      }
    }

    return m_values.size();
  }